

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_impl.cpp
# Opt level: O3

void __thiscall
icu_63::numparse::impl::NumberParserImpl::parseLongestRecursive
          (NumberParserImpl *this,StringSegment *segment,ParsedNumber *result,UErrorCode *status)

{
  NumberParseMatcher *pNVar1;
  bool bVar2;
  int32_t iVar3;
  int iVar4;
  int32_t iVar5;
  uint uVar6;
  int iVar7;
  ParsedNumber candidate;
  ParsedNumber initial;
  long local_200;
  ParsedNumber local_1f0;
  ParsedNumber local_110;
  
  iVar3 = StringSegment::length(segment);
  if (iVar3 != 0) {
    ParsedNumber::ParsedNumber(&local_110,result);
    ParsedNumber::ParsedNumber(&local_1f0);
    iVar3 = StringSegment::getOffset(segment);
    if (0 < this->fNumMatchers) {
      local_200 = 0;
      do {
        pNVar1 = (this->fMatchers).ptr[local_200];
        iVar4 = (*pNVar1->_vptr_NumberParseMatcher[4])(pNVar1,segment);
        if ((char)iVar4 != '\0') {
          iVar4 = 0;
          do {
            iVar5 = StringSegment::length(segment);
            if (iVar5 <= iVar4) break;
            uVar6 = StringSegment::codePointAt(segment,iVar4);
            ParsedNumber::operator=(&local_1f0,&local_110);
            iVar4 = (iVar4 - (uint)(uVar6 < 0x10000)) + 2;
            StringSegment::setLength(segment,iVar4);
            iVar7 = (*pNVar1->_vptr_NumberParseMatcher[3])(pNVar1,segment,&local_1f0,status);
            StringSegment::resetLength(segment);
            if (U_ZERO_ERROR < *status) goto LAB_00270c88;
            iVar5 = StringSegment::getOffset(segment);
            if (iVar5 - iVar3 == iVar4) {
              parseLongestRecursive(this,segment,&local_1f0,status);
              if (U_ZERO_ERROR < *status) goto LAB_00270c88;
              bVar2 = ParsedNumber::isBetterThan(&local_1f0,result);
              if (bVar2) {
                ParsedNumber::operator=(result,&local_1f0);
              }
            }
            StringSegment::setOffset(segment,iVar3);
          } while ((char)iVar7 != '\0');
        }
        local_200 = local_200 + 1;
      } while (local_200 < this->fNumMatchers);
    }
LAB_00270c88:
    UnicodeString::~UnicodeString(&local_1f0.suffix);
    UnicodeString::~UnicodeString(&local_1f0.prefix);
    icu_63::number::impl::DecimalQuantity::~DecimalQuantity(&local_1f0.quantity);
    UnicodeString::~UnicodeString(&local_110.suffix);
    UnicodeString::~UnicodeString(&local_110.prefix);
    icu_63::number::impl::DecimalQuantity::~DecimalQuantity(&local_110.quantity);
  }
  return;
}

Assistant:

void NumberParserImpl::parseLongestRecursive(StringSegment& segment, ParsedNumber& result,
                                             UErrorCode& status) const {
    // Base Case
    if (segment.length() == 0) {
        return;
    }

    // TODO: Give a nice way for the matcher to reset the ParsedNumber?
    ParsedNumber initial(result);
    ParsedNumber candidate;

    int initialOffset = segment.getOffset();
    for (int32_t i = 0; i < fNumMatchers; i++) {
        const NumberParseMatcher* matcher = fMatchers[i];
        if (!matcher->smokeTest(segment)) {
            continue;
        }

        // In a non-greedy parse, we attempt all possible matches and pick the best.
        for (int32_t charsToConsume = 0; charsToConsume < segment.length();) {
            charsToConsume += U16_LENGTH(segment.codePointAt(charsToConsume));

            // Run the matcher on a segment of the current length.
            candidate = initial;
            segment.setLength(charsToConsume);
            bool maybeMore = matcher->match(segment, candidate, status);
            segment.resetLength();
            if (U_FAILURE(status)) {
                return;
            }

            // If the entire segment was consumed, recurse.
            if (segment.getOffset() - initialOffset == charsToConsume) {
                parseLongestRecursive(segment, candidate, status);
                if (U_FAILURE(status)) {
                    return;
                }
                if (candidate.isBetterThan(result)) {
                    result = candidate;
                }
            }

            // Since the segment can be re-used, reset the offset.
            // This does not have an effect if the matcher did not consume any chars.
            segment.setOffset(initialOffset);

            // Unless the matcher wants to see the next char, continue to the next matcher.
            if (!maybeMore) {
                break;
            }
        }
    }
}